

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::getDataScalar
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,GLTextureBuffer *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  iVar1 = dimension(&(this->super_TextureBuffer).format);
  if (iVar1 != 1) {
    std::__cxx11::string::string
              ((string *)&local_30,
               "called getDataScalar on texture which does not have a 1 dimensional format",
               &local_31);
    exception(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (__return_storage_ptr__,
             (ulong)((this->super_TextureBuffer).sizeY * (this->super_TextureBuffer).sizeX));
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> GLTextureBuffer::getDataScalar() {
  if (dimension(format) != 1) exception("called getDataScalar on texture which does not have a 1 dimensional format");
  std::vector<float> outData;
  outData.resize(getSizeX() * getSizeY());

  return outData;
}